

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StrpTimeFunction::Bind
          (StrpTimeFunction *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pVVar1;
  ScalarFunction *pSVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  pointer pEVar8;
  type pEVar9;
  vector<duckdb::Value,_true> *pvVar10;
  ParameterNotResolvedException *this_00;
  InvalidInputException *pIVar11;
  pointer this_01;
  code *pcVar12;
  bool bVar13;
  allocator local_221;
  string error;
  string local_200;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_1e0;
  ScalarFunction *local_1d8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_1d0;
  string format_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  format_strings;
  vector<duckdb::StrpTimeFormat,_true> formats;
  StrpTimeFormat format;
  Value format_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[6])(pEVar8);
  if ((char)iVar6 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar8);
  if ((char)iVar6 == '\0') {
    pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar7);
    ::std::__cxx11::string::string
              ((string *)&format,"strptime format must be a constant",(allocator *)&format_value);
    InvalidInputException::InvalidInputException<>(pIVar11,pEVar9,(string *)&format);
    __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar7);
  ExpressionExecutor::EvaluateScalar(&format_value,context,pEVar9,false);
  format_string._M_dataplus._M_p = (pointer)&format_string.field_2;
  format_string._M_string_length = 0;
  format_string.field_2._M_local_buf[0] = '\0';
  StrpTimeFormat::StrpTimeFormat(&format);
  if (format_value.is_null == true) {
    make_uniq<duckdb::StrpTimeBindData,duckdb::StrpTimeFormat&,std::__cxx11::string&>
              ((duckdb *)&error,&format,&format_string);
    *(pointer *)this = error._M_dataplus._M_p;
  }
  else if (format_value.type_.id_ == VARCHAR) {
    Value::ToString_abi_cxx11_(&error,&format_value);
    ::std::__cxx11::string::operator=((string *)&format_string,(string *)&error);
    ::std::__cxx11::string::~string((string *)&error);
    ::std::__cxx11::string::_M_assign((string *)&format.super_StrTimeFormat.format_specifier);
    StrTimeFormat::ParseFormatSpecifier(&error,&format_string,&format.super_StrTimeFormat);
    if (error._M_string_length != 0) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar7);
      ::std::__cxx11::string::string
                ((string *)&local_200,"Failed to parse format specifier %s: %s",
                 (allocator *)&format_strings);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&format_string);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&error);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (pIVar11,pEVar9,&local_200,&local_50,&local_70);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = StrTimeFormat::HasFormatSpecifier(&format.super_StrTimeFormat,UTC_OFFSET);
    if (bVar3) {
      LogicalType::LogicalType((LogicalType *)&local_200,TIMESTAMP_TZ);
      LogicalType::operator=
                (&(bound_function->super_BaseScalarFunction).return_type,(LogicalType *)&local_200);
      LogicalType::~LogicalType((LogicalType *)&local_200);
    }
    else {
      bVar3 = StrTimeFormat::HasFormatSpecifier(&format.super_StrTimeFormat,NANOSECOND_PADDED);
      if (bVar3) {
        LogicalType::LogicalType((LogicalType *)&local_200,TIMESTAMP_NS);
        LogicalType::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type,(LogicalType *)&local_200
                  );
        LogicalType::~LogicalType((LogicalType *)&local_200);
        bVar3 = ::std::operator==(&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                                   super_Function.name,"strptime");
        if (bVar3) {
          pcVar12 = Parse<duckdb::timestamp_ns_t>;
        }
        else {
          pcVar12 = TryParse<duckdb::timestamp_ns_t>;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,pcVar12);
      }
    }
    make_uniq<duckdb::StrpTimeBindData,duckdb::StrpTimeFormat&,std::__cxx11::string&>
              ((duckdb *)&local_200,&format,&format_string);
    *(pointer *)this = local_200._M_dataplus._M_p;
    ::std::__cxx11::string::~string((string *)&error);
  }
  else {
    LogicalType::LogicalType((LogicalType *)&local_200,VARCHAR);
    LogicalType::LIST((LogicalType *)&error,(LogicalType *)&local_200);
    bVar3 = LogicalType::operator==(&format_value.type_,(LogicalType *)&error);
    LogicalType::~LogicalType((LogicalType *)&error);
    LogicalType::~LogicalType((LogicalType *)&local_200);
    if (!bVar3) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar7);
      ::std::__cxx11::string::string
                ((string *)&error,"strptime format must be a string",(allocator *)&local_200);
      InvalidInputException::InvalidInputException<>(pIVar11,pEVar9,&error);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar10 = ListValue::GetChildren(&format_value);
    local_1e0 = arguments;
    local_1d8 = bound_function;
    local_1d0._M_head_impl = (FunctionData *)this;
    if ((pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(local_1e0,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar7);
      ::std::__cxx11::string::string
                ((string *)&error,"strptime format list must not be empty",(allocator *)&local_200);
      InvalidInputException::InvalidInputException<>(pIVar11,pEVar9,&error);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    format_strings.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    formats.super_vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_strings.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    format_strings.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    formats.super_vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    formats.super_vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar1 = (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = false;
    bVar3 = false;
    for (this_01 = (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start;
        this = (StrpTimeFunction *)local_1d0._M_head_impl, this_01 != pVVar1; this_01 = this_01 + 1)
    {
      Value::ToString_abi_cxx11_(&error,this_01);
      ::std::__cxx11::string::operator=((string *)&format_string,(string *)&error);
      ::std::__cxx11::string::~string((string *)&error);
      ::std::__cxx11::string::_M_assign((string *)&format.super_StrTimeFormat.format_specifier);
      StrTimeFormat::ParseFormatSpecifier(&error,&format_string,&format.super_StrTimeFormat);
      if (error._M_string_length != 0) {
        pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(local_1e0,0);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar7);
        ::std::__cxx11::string::string
                  ((string *)&local_200,"Failed to parse format specifier %s: %s",&local_221);
        ::std::__cxx11::string::string((string *)&local_90,(string *)&format_string);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)&error);
        InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar11,pEVar9,&local_200,&local_90,&local_b0);
        __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar5 = true;
      bVar13 = bVar4 == false;
      bVar4 = true;
      if (bVar13) {
        bVar4 = StrTimeFormat::HasFormatSpecifier(&format.super_StrTimeFormat,UTC_OFFSET);
      }
      if (bVar3 == false) {
        bVar5 = StrTimeFormat::HasFormatSpecifier(&format.super_StrTimeFormat,NANOSECOND_PADDED);
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &format_strings,&format_string);
      ::std::vector<duckdb::StrpTimeFormat,std::allocator<duckdb::StrpTimeFormat>>::
      emplace_back<duckdb::StrpTimeFormat&>
                ((vector<duckdb::StrpTimeFormat,std::allocator<duckdb::StrpTimeFormat>> *)&formats,
                 &format);
      ::std::__cxx11::string::~string((string *)&error);
      bVar3 = bVar5;
    }
    if (bVar4 == false) {
      if (bVar3 != false) {
        LogicalType::LogicalType((LogicalType *)&error,TIMESTAMP_NS);
        pSVar2 = local_1d8;
        LogicalType::operator=
                  (&(local_1d8->super_BaseScalarFunction).return_type,(LogicalType *)&error);
        LogicalType::~LogicalType((LogicalType *)&error);
        bVar3 = ::std::operator==(&(pSVar2->super_BaseScalarFunction).super_SimpleFunction.
                                   super_Function.name,"strptime");
        if (bVar3) {
          pcVar12 = Parse<duckdb::timestamp_ns_t>;
        }
        else {
          pcVar12 = TryParse<duckdb::timestamp_ns_t>;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &pSVar2->function,pcVar12);
      }
    }
    else {
      LogicalType::LogicalType((LogicalType *)&error,TIMESTAMP_TZ);
      LogicalType::operator=
                (&(local_1d8->super_BaseScalarFunction).return_type,(LogicalType *)&error);
      LogicalType::~LogicalType((LogicalType *)&error);
      this = (StrpTimeFunction *)local_1d0;
    }
    make_uniq<duckdb::StrpTimeBindData,duckdb::vector<duckdb::StrpTimeFormat,true>&,duckdb::vector<std::__cxx11::string,true>&>
              ((duckdb *)&error,&formats,&format_strings);
    *(pointer *)this = error._M_dataplus._M_p;
    ::std::vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>::~vector
              (&formats.
                super_vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&format_strings);
  }
  StrTimeFormat::~StrTimeFormat(&format.super_StrTimeFormat);
  ::std::__cxx11::string::~string((string *)&format_string);
  Value::~Value(&format_value);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, ScalarFunction &bound_function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[1]->IsFoldable()) {
			throw InvalidInputException(*arguments[0], "strptime format must be a constant");
		}
		Value format_value = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		string format_string;
		StrpTimeFormat format;
		if (format_value.IsNull()) {
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type().id() == LogicalTypeId::VARCHAR) {
			format_string = format_value.ToString();
			format.format_specifier = format_string;
			string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
			if (!error.empty()) {
				throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
				                            error);
			}
			if (format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET)) {
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED)) {
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
			const auto &children = ListValue::GetChildren(format_value);
			if (children.empty()) {
				throw InvalidInputException(*arguments[0], "strptime format list must not be empty");
			}
			vector<string> format_strings;
			vector<StrpTimeFormat> formats;
			bool has_offset = false;
			bool has_nanos = false;

			for (const auto &child : children) {
				format_string = child.ToString();
				format.format_specifier = format_string;
				string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
				if (!error.empty()) {
					throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
					                            error);
				}
				has_offset = has_offset || format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET);
				has_nanos = has_nanos || format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED);
				format_strings.emplace_back(format_string);
				formats.emplace_back(format);
			}

			if (has_offset) {
				// If any format has UTC offsets, then we have to produce TSTZ
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (has_nanos) {
				// If any format has nanoseconds, then we have to produce TSNS
				// unless there is an offset, in which case we produce
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(formats, format_strings);
		} else {
			throw InvalidInputException(*arguments[0], "strptime format must be a string");
		}
	}